

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceAccessChain
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *var,Instruction *access_chain)

{
  IRContext *this_00;
  uint32_t number_of_elements;
  
  number_of_elements =
       descsroautil::GetNumberOfElementsForArrayOrStruct((this->super_Pass).context_,var);
  if (number_of_elements == 1) {
    UseConstIndexForAccessChain(this,access_chain,0);
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    analysis::DefUseManager::AnalyzeInstUse
              ((this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               access_chain);
    return;
  }
  if (number_of_elements != 0) {
    ReplaceUsersOfAccessChain(this,access_chain,number_of_elements);
    return;
  }
  __assert_fail("number_of_elements != 0 && \"Number of element is 0\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                ,0x52,
                "void spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceAccessChain(Instruction *, Instruction *) const"
               );
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::ReplaceAccessChain(
    Instruction* var, Instruction* access_chain) const {
  uint32_t number_of_elements =
      descsroautil::GetNumberOfElementsForArrayOrStruct(context(), var);
  assert(number_of_elements != 0 && "Number of element is 0");
  if (number_of_elements == 1) {
    UseConstIndexForAccessChain(access_chain, 0);
    get_def_use_mgr()->AnalyzeInstUse(access_chain);
    return;
  }
  ReplaceUsersOfAccessChain(access_chain, number_of_elements);
}